

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O2

elem * __thiscall
cilkred_map::insert_no_rehash
          (cilkred_map *this,__cilkrts_worker *w,void *key,__cilkrts_hyperobject_base *hb,void *view
          )

{
  bucket **ppbVar1;
  size_t sVar2;
  elem *peVar3;
  char *pcVar4;
  undefined8 uVar5;
  
  if ((w == (__cilkrts_worker *)0x0 && this->g == (global_state_t *)0x0) || (w->g == this->g)) {
    if (key == (void *)0x0) {
      pcVar4 = "key != 0";
      uVar5 = 0x1be;
    }
    else {
      if (view != (void *)0x0) {
        ppbVar1 = this->buckets;
        sVar2 = hashfun(this,key);
        peVar3 = grow(w,ppbVar1 + sVar2);
        peVar3->key = key;
        peVar3->hb = hb;
        peVar3->view = view;
        this->nelem = this->nelem + 1;
        return peVar3;
      }
      pcVar4 = "view != 0";
      uVar5 = 0x1bf;
    }
  }
  else {
    pcVar4 = "(w == 0 && g == 0) || w->g == g";
    uVar5 = 0x1bd;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/reducer_impl.cpp"
                ,uVar5,pcVar4);
}

Assistant:

elem *cilkred_map::insert_no_rehash(__cilkrts_worker           *w,
				    void                       *key,
				    __cilkrts_hyperobject_base *hb,
                                    void                       *view)
{

#if REDPAR_DEBUG >= 2
    fprintf(stderr, "[W=%d, desc=insert_no_rehash, this_map=%p]\n",
	    w->self, this);
    verify_current_wkr(w);
#endif
    
    CILK_ASSERT((w == 0 && g == 0) || w->g == g);
    CILK_ASSERT(key != 0);
    CILK_ASSERT(view != 0);
	    
    elem *el = grow(w, &(buckets[hashfun(this, key)]));

#if REDPAR_DEBUG >= 3
    fprintf(stderr, "[W=%d, this=%p, inserting key=%p, view=%p, el = %p]\n",
	    w->self, this, key, view, el);
#endif

    el->key = key;
    el->hb  = hb;
    el->view = view;
    ++nelem;

    return el;
}